

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes WaitId(CSzData *sd,UInt32 id)

{
  SRes SVar1;
  int __result___1;
  int __result__;
  UInt64 type;
  CSzData *pCStack_18;
  UInt32 id_local;
  CSzData *sd_local;
  
  type._4_4_ = id;
  pCStack_18 = sd;
  do {
    SVar1 = ReadNumber(pCStack_18,(UInt64 *)&__result___1);
    if (SVar1 != 0) {
      return SVar1;
    }
    if (___result___1 == type._4_4_) {
      return 0;
    }
    if (___result___1 == 0) {
      return 0x10;
    }
    SVar1 = SkipData(pCStack_18);
  } while (SVar1 == 0);
  return SVar1;
}

Assistant:

static SRes WaitId(CSzData *sd, UInt32 id)
{
  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(sd, &type));
    if (type == id)
      return SZ_OK;
    if (type == k7zIdEnd)
      return SZ_ERROR_ARCHIVE;
    RINOK(SkipData(sd));
  }
}